

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O2

AEStackFrame __thiscall moira::Moira::makeFrame<0ul>(Moira *this,u32 addr,u32 pc)

{
  u16 sr;
  AEStackFrame AVar1;
  
  sr = getSR(this);
  AVar1 = makeFrame<0ul>(this,addr,pc,sr,(this->queue).ird);
  return AVar1;
}

Assistant:

AEStackFrame
Moira::makeFrame(u32 addr, u32 pc)
{
    return makeFrame <F> (addr, pc, getSR(), getIRD());
}